

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWAP.hpp
# Opt level: O1

SquareMatrix<float> __thiscall qclab::qgates::SWAP<float>::matrix(SWAP<float> *this)

{
  undefined4 *puVar1;
  data_type extraout_RDX;
  SquareMatrix<float> SVar2;
  
  (this->super_QGate2<float>).super_QObject<float>._vptr_QObject = (_func_int **)0x4;
  puVar1 = (undefined4 *)operator_new__(0x40);
  *(undefined4 **)(this->qubits_)._M_elems = puVar1;
  *puVar1 = 0x3f800000;
  *(undefined8 *)(puVar1 + 1) = 0;
  *(undefined8 *)(puVar1 + 3) = 0;
  puVar1[5] = 0;
  *(undefined8 *)(puVar1 + 6) = 0x3f800000;
  *(undefined8 *)(puVar1 + 8) = 0x3f80000000000000;
  *(undefined8 *)(puVar1 + 0xe) = 0x3f80000000000000;
  *(undefined8 *)(puVar1 + 10) = 0;
  *(undefined8 *)(puVar1 + 0xc) = 0;
  SVar2.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl =
       extraout_RDX._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
       super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
       super__Head_base<0UL,_float_*,_false>._M_head_impl;
  SVar2.size_ = (size_type_conflict)this;
  return SVar2;
}

Assistant:

qclab::dense::SquareMatrix< T > matrix() const override {
          return qclab::dense::SquareMatrix< T >( 1 , 0 , 0 , 0 ,
                                                  0 , 0 , 1 , 0 ,
                                                  0 , 1 , 0 , 0 ,
                                                  0 , 0 , 0 , 1 ) ;
        }